

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_mp_minmax(_func_void_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_minmax_into)

{
  ulong in_RAX;
  mp_int *dest;
  mp_int *x;
  size_t sVar1;
  mp_int *pmVar2;
  ulong uVar3;
  uint8_t lens [2];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  dest = mp_new(0x100);
  x = mp_new(0x100);
  sVar1 = (*looplimit)(10);
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      random_read((void *)((long)&uStack_38 + 6),2);
      pmVar2 = mp_random_bits_fn(uStack_38 >> 0x30 & 0xff,random_read);
      mp_copy_into(dest,pmVar2);
      mp_free(pmVar2);
      pmVar2 = mp_random_bits_fn(uStack_38 >> 0x38,random_read);
      mp_copy_into(dest,pmVar2);
      mp_free(pmVar2);
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      (*mp_minmax_into)(dest,dest,x);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      uVar3 = uVar3 + 1;
      sVar1 = (*looplimit)(10);
    } while (uVar3 < sVar1);
  }
  mp_free(dest);
  mp_free(x);
  return;
}

Assistant:

static void test_mp_minmax(
    void (*mp_minmax_into)(mp_int *r, mp_int *x, mp_int *y))
{
    mp_int *a = mp_new(256), *b = mp_new(256);
    for (size_t i = 0; i < looplimit(10); i++) {
        uint8_t lens[2];
        random_read(lens, 2);
        mp_int *x = mp_random_bits(lens[0]);
        mp_copy_into(a, x);
        mp_free(x);
        mp_int *y = mp_random_bits(lens[1]);
        mp_copy_into(a, y);
        mp_free(y);
        log_start();
        mp_minmax_into(a, a, b);
        log_end();
    }
    mp_free(a);
    mp_free(b);
}